

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.h
# Opt level: O0

void mjs::
     make_constructable<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__16>
               (gc_heap_ptr<mjs::global_object> *global,gc_heap_ptr<mjs::function_object> *o,
               anon_class_16_1_570cf4e1_for_f *f)

{
  value_type vVar1;
  version vVar2;
  function_object *pfVar3;
  global_object *pgVar4;
  object_ptr *this;
  object *poVar5;
  gc_heap_ptr<mjs::object> local_a0;
  value local_90;
  string local_68 [2];
  undefined1 local_48 [8];
  value p;
  anon_class_16_1_570cf4e1_for_f *f_local;
  gc_heap_ptr<mjs::function_object> *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  p.field_1._24_8_ = f;
  pfVar3 = gc_heap_ptr<mjs::function_object>::operator->(o);
  function_object::
  construct_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__16>
            (pfVar3,(anon_class_16_1_570cf4e1_for_f *)p.field_1._24_8_);
  pfVar3 = gc_heap_ptr<mjs::function_object>::operator->(o);
  function_object::get_prototype((value *)local_48,pfVar3);
  vVar1 = value::type((value *)local_48);
  if (vVar1 == object) {
    pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
    vVar2 = global_object::language_version(pgVar4);
    if ((int)vVar2 < 1) {
      this = value::object_value((value *)local_48);
      poVar5 = gc_heap_ptr<mjs::object>::operator->(this);
      pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
      (*(pgVar4->super_object)._vptr_object[0x13])(local_68,pgVar4,"constructor");
      gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>(&local_a0,o);
      value::value(&local_90,&local_a0);
      (*poVar5->_vptr_object[1])(poVar5,local_68,&local_90,2);
      value::~value(&local_90);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_a0);
      string::~string(local_68);
    }
    value::~value((value *)local_48);
    return;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:121:35)]"
               );
}

Assistant:

void make_constructable(const gc_heap_ptr<global_object>& global, gc_heap_ptr<function_object>& o, const F& f) {
    o->construct_function(f);
    auto p = o->get_prototype();
    assert(p.type() == value_type::object);
    if (global->language_version() < version::es3) {
        p.object_value()->put(global->common_string("constructor"), value{o}, property_attribute::dont_enum);
    }
}